

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

reverse_iterator * __thiscall
immutable::transient_vector<int,_true,_5>::rend
          (reverse_iterator *__return_storage_ptr__,transient_vector<int,_true,_5> *this)

{
  iterator local_38;
  transient_vector<int,_true,_5> *local_18;
  transient_vector<int,_true,_5> *this_local;
  
  local_18 = this;
  this_local = (transient_vector<int,_true,_5> *)__return_storage_ptr__;
  begin(&local_38,this);
  std::reverse_iterator<immutable::vector_iterator<int,_true,_5>_>::reverse_iterator
            (__return_storage_ptr__,&local_38);
  vector_iterator<int,_true,_5>::~vector_iterator(&local_38);
  return __return_storage_ptr__;
}

Assistant:

reverse_iterator rend() const
        {
        return reverse_iterator{ begin() };
        }